

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O0

char * kws_search_hyp(ps_search_t *search,int32 *out_score)

{
  char *pcVar1;
  kws_search_t *kwss;
  int32 *out_score_local;
  ps_search_t *search_local;
  
  if (out_score != (int32 *)0x0) {
    *out_score = 0;
  }
  if (search->hyp_str != (char *)0x0) {
    ckd_free(search->hyp_str);
  }
  pcVar1 = kws_detections_hyp_str
                     ((kws_detections_t *)search[1].name,*(int *)&search[1].pls,
                      *(int *)((long)&search[1].acmod + 4));
  search->hyp_str = pcVar1;
  return search->hyp_str;
}

Assistant:

char const *
kws_search_hyp(ps_search_t * search, int32 * out_score)
{
    kws_search_t *kwss = (kws_search_t *) search;
    if (out_score)
        *out_score = 0;

    if (search->hyp_str)
        ckd_free(search->hyp_str);
    search->hyp_str = kws_detections_hyp_str(kwss->detections, kwss->frame, kwss->delay);

    return search->hyp_str;
}